

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O3

void shuff_calculate_minimum_redundancy(uint64_t *freq,uint64_t *syms,int64_t n)

{
  long lVar1;
  uint64_t *puVar2;
  long lVar3;
  long lVar4;
  uint64_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  if (n != 0) {
    if (n == 1) {
      freq[*syms] = 0;
      return;
    }
    freq[*syms] = freq[*syms] + freq[syms[1]];
    if (n < 3) {
      freq[syms[n + -2]] = 0;
    }
    else {
      lVar3 = 2;
      uVar7 = 1;
      uVar8 = 0;
      do {
        if ((lVar3 < n) && (uVar9 = freq[syms[lVar3]], uVar9 <= freq[syms[uVar8]])) {
          lVar3 = lVar3 + 1;
          uVar12 = uVar8;
          uVar11 = uVar7;
        }
        else {
          freq[syms[uVar7]] = freq[syms[uVar8]];
          uVar12 = uVar8 + 1;
          uVar9 = uVar7;
          uVar11 = uVar8;
        }
        uVar8 = uVar12;
        freq[syms[uVar11]] = uVar9;
        if (lVar3 < n) {
          if ((long)uVar8 < (long)uVar7) {
            uVar9 = freq[syms[uVar8]];
            uVar12 = freq[syms[lVar3]];
            if (uVar9 < uVar12) goto LAB_00105750;
          }
          else {
            uVar12 = freq[syms[lVar3]];
          }
          lVar3 = lVar3 + 1;
          freq[syms[uVar7]] = freq[syms[uVar7]] + uVar12;
        }
        else {
          uVar9 = freq[syms[uVar8]];
LAB_00105750:
          freq[syms[uVar7]] = freq[syms[uVar7]] + uVar9;
          puVar2 = syms + uVar8;
          uVar8 = uVar8 + 1;
          freq[*puVar2] = uVar7;
        }
        lVar4 = (3 - n) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar4 != 1);
      freq[syms[n + -2]] = 0;
      if (2 < n) {
        lVar3 = n + -3;
        do {
          puVar2 = syms + lVar3;
          bVar13 = lVar3 != 0;
          lVar3 = lVar3 + -1;
          freq[*puVar2] = freq[syms[freq[*puVar2]]] + 1;
        } while (bVar13);
      }
    }
    lVar4 = n + -2;
    lVar6 = n + -1;
    lVar3 = 1;
    uVar5 = 0;
    do {
      if (lVar4 < 0) {
        lVar10 = 0;
      }
      else {
        lVar1 = lVar4 + 1;
        lVar10 = 0;
        do {
          if (freq[syms[lVar4]] != uVar5) goto LAB_00105822;
          lVar10 = lVar10 + 1;
          lVar4 = lVar4 + -1;
        } while (lVar1 != lVar10);
        lVar4 = -1;
        lVar10 = lVar1;
      }
LAB_00105822:
      for (; lVar10 < lVar3; lVar3 = lVar3 + -1) {
        puVar2 = syms + lVar6;
        lVar6 = lVar6 + -1;
        freq[*puVar2] = uVar5;
      }
      lVar3 = lVar10 * 2;
      uVar5 = uVar5 + 1;
    } while (lVar10 != 0);
  }
  return;
}

Assistant:

void shuff_calculate_minimum_redundancy(
    uint64_t freq[], uint64_t syms[], int64_t n)
{
    int64_t root; /* next root node to be used */
    int64_t leaf; /* next leaf to be used */
    int64_t next; /* next value to be assigned */
    int64_t avbl; /* number of available nodes */
    int64_t used; /* number of internal nodes */
    uint64_t dpth; /* current depth of leaves */

    /* check for pathological cases */
    if (n == 0) {
        return;
    }
    if (n == 1) {
        freq[syms[0]] = 0;
        return;
    }

    /* first pass, left to right, setting parent pointers */
    freq[syms[0]] += freq[syms[1]];
    root = 0;
    leaf = 2;
    for (next = 1; next < n - 1; next++) {
        /* select first item for a pairing */
        if (leaf >= n || freq[syms[root]] < freq[syms[leaf]]) {
            freq[syms[next]] = freq[syms[root]];
            freq[syms[root++]] = next;
        } else
            freq[syms[next]] = freq[syms[leaf++]];

        /* add on the second item */
        if (leaf >= n || (root < next && freq[syms[root]] < freq[syms[leaf]])) {
            freq[syms[next]] += freq[syms[root]];
            freq[syms[root++]] = next;
        } else
            freq[syms[next]] += freq[syms[leaf++]];
    }

    /* second pass, right to left, setting internal depths */
    freq[syms[n - 2]] = 0;
    for (next = n - 3; next >= 0; next--)
        freq[syms[next]] = freq[syms[freq[syms[next]]]] + 1;

    /* third pass, right to left, setting leaf depths */
    avbl = 1;
    used = dpth = 0;
    root = n - 2;
    next = n - 1;
    while (avbl > 0) {
        while (root >= 0 && freq[syms[root]] == dpth) {
            used++;
            root--;
        }
        while (avbl > used) {
            freq[syms[next--]] = dpth;
            avbl--;
        }
        avbl = 2 * used;
        dpth++;
        used = 0;
    }
}